

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_sauf_background.h
# Opt level: O0

void __thiscall SAUF_BG<RemSP>::SecondScan(SAUF_BG<RemSP> *this)

{
  uint uVar1;
  uint *puVar2;
  uint *img_row_end;
  uint *img_row_start;
  int r;
  SAUF_BG<RemSP> *this_local;
  
  uVar1 = RemSP::Flatten();
  (this->super_Labeling2D<(Connectivity2D)8,_true>).n_labels_ = uVar1;
  for (img_row_start._4_4_ = 0;
      img_row_start._4_4_ <
      *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_true>).img_labels_)->field_0x8;
      img_row_start._4_4_ = img_row_start._4_4_ + 1) {
    img_row_end = cv::Mat::ptr<unsigned_int>
                            (&((this->super_Labeling2D<(Connectivity2D)8,_true>).img_labels_)->
                              super_Mat,img_row_start._4_4_);
    puVar2 = img_row_end +
             *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_true>).img_labels_)->field_0xc;
    for (; img_row_end != puVar2; img_row_end = img_row_end + 1) {
      uVar1 = RemSP::GetLabel(*img_row_end);
      *img_row_end = uVar1;
    }
  }
  return;
}

Assistant:

void SecondScan()
    {
        n_labels_ = LabelsSolver::Flatten();

        for (int r = 0; r < img_labels_.rows; ++r) {
            unsigned * img_row_start = img_labels_.ptr<unsigned>(r);
            unsigned * const img_row_end = img_row_start + img_labels_.cols;
            for (; img_row_start != img_row_end; ++img_row_start) {
                *img_row_start = LabelsSolver::GetLabel(*img_row_start);
            }
        }
    }